

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall cmGeneratorTarget::GetLinkPIEProperty(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  int iVar2;
  PolicyStatus PVar3;
  cmGeneratorTarget *local_90;
  PolicyStatus status;
  allocator<char> local_61;
  string local_60;
  string local_40;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  if (GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetLinkPIEProperty(std::__cxx11::string_const&)::
                                 PICValue_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"POSITION_INDEPENDENT_CODE",&local_61);
  GetLinkInterfaceDependentStringAsBoolProperty(&local_40,this,&local_60,local_20);
  std::__cxx11::string::operator=
            ((string *)&GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_,
             (string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar1 = std::operator==(&GetLinkPIEProperty(std::__cxx11::string_const&)::PICValue_abi_cxx11_,
                          "(unset)");
  if (bVar1) {
    this_local = (cmGeneratorTarget *)0x0;
  }
  else {
    PVar3 = GetPolicyStatusCMP0083(this);
    if ((PVar3 == WARN) || (PVar3 == OLD)) {
      local_90 = (cmGeneratorTarget *)0x0;
    }
    else {
      local_90 = (cmGeneratorTarget *)std::__cxx11::string::c_str();
    }
    this_local = local_90;
  }
  return (char *)this_local;
}

Assistant:

const char* cmGeneratorTarget::GetLinkPIEProperty(
  const std::string& config) const
{
  static std::string PICValue;

  PICValue = this->GetLinkInterfaceDependentStringAsBoolProperty(
    "POSITION_INDEPENDENT_CODE", config);

  if (PICValue == "(unset)") {
    // POSITION_INDEPENDENT_CODE is not set
    return nullptr;
  }

  auto status = this->GetPolicyStatusCMP0083();
  return (status != cmPolicies::WARN && status != cmPolicies::OLD)
    ? PICValue.c_str()
    : nullptr;
}